

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<unsigned_long_long,long_long,double>
               (ImGuiDataType data_type,unsigned_long_long *v,float v_speed,unsigned_long_long v_min
               ,unsigned_long_long v_max,char *format,ImGuiSliderFlags flags)

{
  bool bVar1;
  float *pfVar2;
  char *format_00;
  char *in_RCX;
  char *in_RDX;
  ulong *in_RSI;
  int in_EDI;
  uint in_R9D;
  float in_XMM0_Da;
  float fVar3;
  float in_stack_0000002c;
  float in_stack_00000030;
  bool in_stack_00000037;
  undefined4 in_stack_00000038;
  float in_stack_0000003c;
  float v_new_parametric_1;
  float v_new_parametric;
  float v_old_parametric;
  int decimal_precision_1;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  double v_old_ref_for_accum_remainder;
  unsigned_long_long v_cur;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  int decimal_precision;
  float adjust_delta;
  bool is_logarithmic;
  bool is_clamped;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiContext *g;
  int in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  float local_b0;
  float local_a8;
  int local_a0;
  float local_98;
  float in_stack_ffffffffffffff70;
  undefined3 in_stack_ffffffffffffff74;
  uint3 uVar4;
  ImGuiInputReadMode in_stack_ffffffffffffff78;
  ImGuiNavDirSourceFlags in_stack_ffffffffffffff7c;
  undefined4 uVar5;
  float fVar6;
  double dVar7;
  ImVec2 local_58;
  int local_50;
  float local_4c;
  byte local_47;
  byte local_46;
  byte local_45;
  uint local_44;
  ImGuiContext *local_40;
  uint local_34;
  char *local_28;
  char *local_20;
  float local_14;
  ulong *local_10;
  bool local_1;
  
  local_40 = GImGui;
  local_44 = (uint)((in_R9D & 0x100000) != 0);
  uVar5 = CONCAT13(1,in_stack_ffffffffffffff74);
  if (in_EDI != 8) {
    uVar5 = CONCAT13(in_EDI == 9,in_stack_ffffffffffffff74);
  }
  local_45 = (byte)((uint)uVar5 >> 0x18);
  local_46 = in_RDX < in_RCX;
  uVar4 = (uint3)(ushort)uVar5;
  if ((in_R9D & 0x20) != 0) {
    uVar4 = CONCAT12(local_45,(ushort)uVar5);
  }
  fVar6 = (float)CONCAT13(local_45,uVar4);
  local_47 = (byte)(uVar4 >> 0x10);
  local_14 = in_XMM0_Da;
  if ((((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) && ((bool)local_46)) &&
     (in_stack_ffffffffffffff70 = (float)(ulong)((long)in_RCX - (long)in_RDX),
     in_stack_ffffffffffffff70 < 3.4028235e+38)) {
    local_98 = (float)(ulong)((long)in_RCX - (long)in_RDX);
    local_14 = local_98 * GImGui->DragSpeedDefaultRatio;
  }
  local_4c = 0.0;
  local_34 = in_R9D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RSI;
  if (((GImGui->ActiveIdSource != ImGuiInputSource_Mouse) ||
      (bVar1 = IsMousePosValid((ImVec2 *)0x0), !bVar1)) ||
     ((local_40->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
    if (local_40->ActiveIdSource == ImGuiInputSource_Nav) {
      if ((local_45 & 1) == 0) {
        local_a0 = 0;
      }
      else {
        local_a0 = ImParseFormatPrecision
                             ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (int)in_stack_ffffffffffffff44);
      }
      local_50 = local_a0;
      local_58 = GetNavInputAmount2d(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,fVar6,
                                     in_stack_ffffffffffffff70);
      pfVar2 = ImVec2::operator[](&local_58,(long)(int)local_44);
      fVar6 = local_14;
      local_4c = *pfVar2;
      fVar3 = GetMinimumStepAtDecimalPrecision(in_stack_ffffffffffffff40);
      local_14 = ImMax<float>(fVar6,fVar3);
    }
  }
  else {
    pfVar2 = ImVec2::operator[](&(local_40->IO).MouseDelta,(long)(int)local_44);
    local_4c = *pfVar2;
    if (((local_40->IO).KeyAlt & 1U) != 0) {
      local_4c = local_4c * 0.01;
    }
    if (((local_40->IO).KeyShift & 1U) != 0) {
      local_4c = local_4c * 10.0;
    }
  }
  local_4c = local_14 * local_4c;
  if (local_44 == 1) {
    local_4c = -local_4c;
  }
  if (((local_47 & 1) != 0) &&
     (local_a8 = (float)(ulong)((long)local_28 - (long)local_20), local_a8 < 3.4028235e+38)) {
    in_stack_ffffffffffffff4c = (float)((long)local_28 - (long)local_20);
    local_b0 = (float)(ulong)((long)local_28 - (long)local_20);
    if (1e-06 < local_b0) {
      in_stack_ffffffffffffff44 = (float)((long)local_28 - (long)local_20);
      in_stack_ffffffffffffff48 = (float)(ulong)((long)local_28 - (long)local_20);
      local_4c = local_4c / in_stack_ffffffffffffff48;
    }
  }
  bVar1 = false;
  if (((local_46 & 1) != 0) && (((char *)*local_10 < local_28 || (bVar1 = true, local_4c <= 0.0))))
  {
    bVar1 = (char *)*local_10 <= local_20 && local_4c < 0.0;
  }
  if (((local_40->ActiveIdIsJustActivated & 1U) != 0) || (bVar1)) {
    local_40->DragCurrentAccum = 0.0;
    local_40->DragCurrentAccumDirty = false;
  }
  else if ((local_4c != 0.0) || (NAN(local_4c))) {
    local_40->DragCurrentAccum = local_4c + local_40->DragCurrentAccum;
    local_40->DragCurrentAccumDirty = true;
  }
  if ((local_40->DragCurrentAccumDirty & 1U) == 0) {
    local_1 = false;
  }
  else {
    dVar7 = 0.0;
    fVar6 = 0.0;
    uVar5 = 0;
    if ((local_47 & 1) == 0) {
      format_00 = (char *)((long)local_40->DragCurrentAccum + *local_10);
    }
    else {
      if ((local_45 & 1) != 0) {
        ImParseFormatPrecision
                  ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (int)in_stack_ffffffffffffff44);
      }
      fVar6 = ImPow(0.0,2.489432e-39);
      fVar3 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                        ((ImGuiDataType)zero_deadzone_halfsize,_v_old_parametric,
                         CONCAT44(v_new_parametric,v_new_parametric_1),
                         CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000037,
                         in_stack_00000030,in_stack_0000002c);
      format_00 = (char *)ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                                    (v_old_ref_for_accum_remainder._4_4_,
                                     v_old_ref_for_accum_remainder._0_4_,
                                     CONCAT44(logarithmic_zero_epsilon,zero_deadzone_halfsize),
                                     _v_old_parametric,v_new_parametric._3_1_,v_new_parametric_1,
                                     in_stack_0000003c);
      dVar7 = (double)fVar3;
    }
    if ((local_34 & 0x40) == 0) {
      format_00 = (char *)RoundScalarWithFormatT<unsigned_long_long,long_long>
                                    (format_00,(ImGuiDataType)((ulong)dVar7 >> 0x20),
                                     CONCAT44(fVar6,uVar5));
    }
    local_40->DragCurrentAccumDirty = false;
    if ((local_47 & 1) == 0) {
      local_40->DragCurrentAccum =
           local_40->DragCurrentAccum - (float)(long)((long)format_00 - *local_10);
    }
    else {
      fVar6 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                        ((ImGuiDataType)zero_deadzone_halfsize,_v_old_parametric,
                         CONCAT44(v_new_parametric,v_new_parametric_1),
                         CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000037,
                         in_stack_00000030,in_stack_0000002c);
      local_40->DragCurrentAccum = local_40->DragCurrentAccum - (float)((double)fVar6 - dVar7);
    }
    if (format_00 == (char *)0x0) {
      format_00 = (char *)0x0;
    }
    if (((char *)*local_10 != format_00) && ((local_46 & 1) != 0)) {
      if ((format_00 < local_20) ||
         ((((char *)*local_10 < format_00 && (local_4c < 0.0)) && ((local_45 & 1) == 0)))) {
        format_00 = local_20;
      }
      if ((local_28 < format_00) ||
         (((format_00 < (char *)*local_10 && (0.0 < local_4c)) && ((local_45 & 1) == 0)))) {
        format_00 = local_28;
      }
    }
    if ((char *)*local_10 == format_00) {
      local_1 = false;
    }
    else {
      *local_10 = (ulong)format_00;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f * 1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}